

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlFindExtraHandler(char *norig,char *name,int output,xmlCharEncConvImpl impl,void *implCtxt,
                       xmlCharEncodingHandler **out)

{
  xmlCharEncodingHandlerPtr pxVar1;
  int iVar2;
  xmlCharEncodingHandler *pxVar3;
  char *pcVar4;
  undefined8 *puVar5;
  iconv_t pvVar6;
  undefined8 *puVar7;
  iconv_t pvVar8;
  code *pcVar9;
  int *piVar10;
  code *pcVar11;
  xmlIconvCtxt *ctxt_1;
  xmlIconvCtxt *ctxt;
  long lVar12;
  xmlCharEncConverter local_58;
  
  pxVar3 = (xmlCharEncodingHandler *)(*xmlMalloc)(0x48);
  if (pxVar3 == (xmlCharEncodingHandler *)0x0) {
    return 2;
  }
  pxVar3->outputCtxt = (void *)0x0;
  pxVar3->ctxtDtor = (xmlCharEncConvCtxtDtor)0x0;
  pxVar3->iconv_out = (void *)0x0;
  pxVar3->inputCtxt = (void *)0x0;
  pxVar3->output = (xmlCharEncodingOutputFunc)0x0;
  pxVar3->iconv_in = (void *)0x0;
  pxVar3->name = (char *)0x0;
  pxVar3->input = (xmlCharEncodingInputFunc)0x0;
  *(undefined8 *)&pxVar3->flags = 0;
  pcVar4 = (*xmlMemStrdup)(name);
  pxVar3->name = pcVar4;
  if (pcVar4 == (char *)0x0) {
    iVar2 = 2;
LAB_0012bb30:
    (*xmlFree)(pxVar3->name);
    (*xmlFree)(pxVar3);
  }
  else {
    if (impl == (xmlCharEncConvImpl)0x0) {
      if ((globalHandlers != (xmlCharEncodingHandlerPtr *)0x0) && (0 < nbCharEncodingHandler)) {
        lVar12 = 0;
        do {
          pxVar1 = globalHandlers[lVar12];
          iVar2 = xmlStrcasecmp((xmlChar *)name,(xmlChar *)pxVar1->name);
          if ((iVar2 == 0) && ((&pxVar1->input)[output != 0] != (xmlCharEncodingInputFunc)0x0)) {
            *out = pxVar1;
            iVar2 = 0;
            goto LAB_0012bb30;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < nbCharEncodingHandler);
      }
      pcVar4 = strstr(name,"//");
      iVar2 = 0x20;
      if (pcVar4 == (char *)0x0) {
        puVar5 = (undefined8 *)(*xmlMalloc)(8);
        if (puVar5 == (undefined8 *)0x0) {
          puVar7 = (undefined8 *)0x0;
          puVar5 = (undefined8 *)0x0;
LAB_0012bade:
          iVar2 = 2;
          goto LAB_0012bae3;
        }
        *puVar5 = 0xffffffffffffffff;
        pvVar6 = iconv_open("UTF-8",name);
        if (pvVar6 == (iconv_t)0xffffffffffffffff) {
          piVar10 = __errno_location();
          if (*piVar10 != 0x16) {
            if (*piVar10 == 0xc) goto LAB_0012badb;
            iVar2 = 0x74;
          }
          puVar7 = (undefined8 *)0x0;
          goto LAB_0012bae3;
        }
        *puVar5 = pvVar6;
        puVar7 = (undefined8 *)(*xmlMalloc)(8);
        if (puVar7 == (undefined8 *)0x0) {
LAB_0012badb:
          puVar7 = (undefined8 *)0x0;
          goto LAB_0012bade;
        }
        *puVar7 = 0xffffffffffffffff;
        pvVar8 = iconv_open(name,"UTF-8");
        if (pvVar8 == (iconv_t)0xffffffffffffffff) {
          piVar10 = __errno_location();
          if (*piVar10 != 0x16) {
            if (*piVar10 == 0xc) goto LAB_0012bade;
            iVar2 = 0x74;
          }
          goto LAB_0012bae3;
        }
        *puVar7 = pvVar8;
        pxVar3->iconv_in = pvVar6;
        pxVar3->iconv_out = pvVar8;
        iVar2 = 0;
        pcVar11 = xmlIconvFree;
        pcVar9 = xmlIconvConvert;
      }
      else {
        puVar7 = (undefined8 *)0x0;
        puVar5 = (undefined8 *)0x0;
LAB_0012bae3:
        if (puVar5 != (undefined8 *)0x0) {
          if ((iconv_t)*puVar5 != (iconv_t)0xffffffffffffffff) {
            iconv_close((iconv_t)*puVar5);
          }
          (*xmlFree)(puVar5);
        }
        if (puVar7 != (undefined8 *)0x0) {
          if ((iconv_t)*puVar7 != (iconv_t)0xffffffffffffffff) {
            iconv_close((iconv_t)*puVar7);
          }
          (*xmlFree)(puVar7);
        }
        pcVar9 = (xmlCharEncodingInputFunc)0x0;
        pcVar11 = (xmlCharEncConvCtxtDtor)0x0;
        puVar5 = (undefined8 *)0x0;
        puVar7 = (undefined8 *)0x0;
      }
      if (iVar2 != 0) goto LAB_0012bb30;
      pxVar3->input = pcVar9;
      pxVar3->output = pcVar9;
      pxVar3->ctxtDtor = pcVar11;
      pxVar3->inputCtxt = puVar5;
      pxVar3->outputCtxt = puVar7;
    }
    else {
      local_58.ctxtDtor = (xmlCharEncConvCtxtDtor)0x0;
      local_58.inputCtxt = (void *)0x0;
      local_58.input = (xmlCharEncConvFunc)0x0;
      local_58.output = (xmlCharEncConvFunc)0x0;
      local_58.outputCtxt = (void *)0x0;
      iVar2 = (*impl)(implCtxt,norig,&local_58);
      if (iVar2 != 0) goto LAB_0012bb30;
      pxVar3->input = (xmlCharEncodingInputFunc)local_58.input;
      pxVar3->output = (xmlCharEncodingOutputFunc)local_58.output;
      pxVar3->ctxtDtor = local_58.ctxtDtor;
      pxVar3->inputCtxt = local_58.inputCtxt;
      pxVar3->outputCtxt = local_58.outputCtxt;
    }
    *out = pxVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlFindExtraHandler(const char *norig, const char *name, int output,
                    xmlCharEncConvImpl impl, void *implCtxt,
                    xmlCharEncodingHandler **out) {
    xmlCharEncodingHandler *handler;
    int ret;
    int i;

    handler = xmlMalloc(sizeof(*handler));
    if (handler == NULL)
        return(XML_ERR_NO_MEMORY);
    memset(handler, 0, sizeof(*handler));

    handler->name = xmlMemStrdup(name);
    if (handler->name == NULL) {
        ret = XML_ERR_NO_MEMORY;
        goto done;
    }

    /*
     * Try custom implementation before deprecated global handlers.
     *
     * Note that we pass the original name without deprecated
     * alias resolution.
     */
    if (impl != NULL) {
        ret = xmlInvokeConvImpl(impl, implCtxt, norig, handler);
        if (ret != XML_ERR_OK)
            goto done;

        *out = handler;
        return(XML_ERR_OK);
    }

    /*
     * Deprecated
     */
    if (globalHandlers != NULL) {
        for (i = 0; i < nbCharEncodingHandler; i++) {
            xmlCharEncodingHandler *h = globalHandlers[i];

            if (!xmlStrcasecmp((const xmlChar *) name,
                               (const xmlChar *) h->name)) {
                if ((output ? h->output : h->input) != NULL) {
                    *out = h;
                    ret = XML_ERR_OK;
                    goto done;
                }
            }
        }
    }

#ifdef LIBXML_ICONV_ENABLED
    ret = xmlInvokeConvImpl(xmlCharEncIconv, handler, name, handler);
    if (ret == XML_ERR_OK) {
        *out = handler;
        return(XML_ERR_OK);
    }
    if (ret != XML_ERR_UNSUPPORTED_ENCODING)
        goto done;
#endif /* LIBXML_ICONV_ENABLED */

#ifdef LIBXML_ICU_ENABLED
    ret = xmlInvokeConvImpl(xmlCharEncUconv, handler, name, handler);
    if (ret == XML_ERR_OK) {
        *out = handler;
        return(XML_ERR_OK);
    }
    if (ret != XML_ERR_UNSUPPORTED_ENCODING)
        goto done;
#endif /* LIBXML_ICU_ENABLED */

    ret = XML_ERR_UNSUPPORTED_ENCODING;

done:
    if (handler != NULL) {
        xmlFree(handler->name);
        xmlFree(handler);
    }

    return(ret);
}